

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::AdamOptimizer::AdamOptimizer(AdamOptimizer *this,AdamOptimizer *from)

{
  bool bVar1;
  InternalMetadataWithArenaLite *this_00;
  Int64Parameter *this_01;
  DoubleParameter *pDVar2;
  AdamOptimizer *from_local;
  AdamOptimizer *this_local;
  Container *local_20;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__AdamOptimizer_00d5b4d0;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_00);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,&local_20->unknown_fields);
  }
  bVar1 = has_learningrate(from);
  if (bVar1) {
    pDVar2 = (DoubleParameter *)operator_new(0x28);
    DoubleParameter::DoubleParameter(pDVar2,from->learningrate_);
    this->learningrate_ = pDVar2;
  }
  else {
    this->learningrate_ = (DoubleParameter *)0x0;
  }
  bVar1 = has_minibatchsize(from);
  if (bVar1) {
    this_01 = (Int64Parameter *)operator_new(0x28);
    Int64Parameter::Int64Parameter(this_01,from->minibatchsize_);
    this->minibatchsize_ = this_01;
  }
  else {
    this->minibatchsize_ = (Int64Parameter *)0x0;
  }
  bVar1 = has_beta1(from);
  if (bVar1) {
    pDVar2 = (DoubleParameter *)operator_new(0x28);
    DoubleParameter::DoubleParameter(pDVar2,from->beta1_);
    this->beta1_ = pDVar2;
  }
  else {
    this->beta1_ = (DoubleParameter *)0x0;
  }
  bVar1 = has_beta2(from);
  if (bVar1) {
    pDVar2 = (DoubleParameter *)operator_new(0x28);
    DoubleParameter::DoubleParameter(pDVar2,from->beta2_);
    this->beta2_ = pDVar2;
  }
  else {
    this->beta2_ = (DoubleParameter *)0x0;
  }
  bVar1 = has_eps(from);
  if (bVar1) {
    pDVar2 = (DoubleParameter *)operator_new(0x28);
    DoubleParameter::DoubleParameter(pDVar2,from->eps_);
    this->eps_ = pDVar2;
  }
  else {
    this->eps_ = (DoubleParameter *)0x0;
  }
  return;
}

Assistant:

AdamOptimizer::AdamOptimizer(const AdamOptimizer& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_learningrate()) {
    learningrate_ = new ::CoreML::Specification::DoubleParameter(*from.learningrate_);
  } else {
    learningrate_ = NULL;
  }
  if (from.has_minibatchsize()) {
    minibatchsize_ = new ::CoreML::Specification::Int64Parameter(*from.minibatchsize_);
  } else {
    minibatchsize_ = NULL;
  }
  if (from.has_beta1()) {
    beta1_ = new ::CoreML::Specification::DoubleParameter(*from.beta1_);
  } else {
    beta1_ = NULL;
  }
  if (from.has_beta2()) {
    beta2_ = new ::CoreML::Specification::DoubleParameter(*from.beta2_);
  } else {
    beta2_ = NULL;
  }
  if (from.has_eps()) {
    eps_ = new ::CoreML::Specification::DoubleParameter(*from.eps_);
  } else {
    eps_ = NULL;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.AdamOptimizer)
}